

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O1

void __thiscall duckdb::PerfectAggregateHashTable::Destroy(PerfectAggregateHashTable *this)

{
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  pointer pAVar1;
  data_ptr_t pdVar2;
  TupleDataLayout *pTVar3;
  type pTVar4;
  AggregateObject *aggr;
  pointer pAVar5;
  bool bVar6;
  idx_t count;
  ulong uVar7;
  data_ptr_t pdVar8;
  RowOperationsState row_state;
  undefined1 local_48 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_40;
  Vector *local_38;
  
  this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
  pTVar3 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
  pAVar5 = (pTVar3->aggregates).
           super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (pTVar3->aggregates).
           super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar5 != pAVar1) {
    bVar6 = false;
    do {
      if ((pAVar5->function).destructor != (aggregate_destructor_t)0x0) {
        bVar6 = true;
      }
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != pAVar1);
    if (bVar6) {
      local_38 = &this->addresses;
      pdVar2 = (this->addresses).data;
      local_48 = (undefined1  [8])
                 unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                 ::operator*(&this->aggregate_allocator);
      local_40._M_head_impl = (Vector *)0x0;
      if (this->total_groups == 0) {
        count = 0;
      }
      else {
        pdVar8 = this->data;
        uVar7 = 0;
        count = 0;
        do {
          *(data_ptr_t *)(pdVar2 + count * 8) = pdVar8;
          count = count + 1;
          if (count == 0x800) {
            pTVar4 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
            RowOperations::DestroyStates((RowOperationsState *)local_48,pTVar4,local_38,0x800);
            count = 0;
          }
          pdVar8 = pdVar8 + this->tuple_size;
          uVar7 = uVar7 + 1;
        } while (uVar7 < this->total_groups);
      }
      pTVar4 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
      RowOperations::DestroyStates((RowOperationsState *)local_48,pTVar4,local_38,count);
      if ((_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
          local_40._M_head_impl != (Vector *)0x0) {
        ::std::default_delete<duckdb::Vector>::operator()
                  ((default_delete<duckdb::Vector> *)&local_40,local_40._M_head_impl);
      }
    }
  }
  return;
}

Assistant:

void PerfectAggregateHashTable::Destroy() {
	// check if there is any destructor to call
	bool has_destructor = false;
	for (auto &aggr : layout_ptr->GetAggregates()) {
		if (aggr.function.destructor) {
			has_destructor = true;
		}
	}
	if (!has_destructor) {
		return;
	}
	// there are aggregates with destructors: loop over the hash table
	// and call the destructor method for each of the aggregates
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	idx_t count = 0;

	// iterate over all initialised slots of the hash table
	RowOperationsState row_state(*aggregate_allocator);
	data_ptr_t payload_ptr = data;
	for (idx_t i = 0; i < total_groups; i++) {
		data_pointers[count++] = payload_ptr;
		if (count == STANDARD_VECTOR_SIZE) {
			RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
			count = 0;
		}
		payload_ptr += tuple_size;
	}
	RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
}